

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskROM.cpp
# Opt level: O0

void __thiscall MSX::DiskROM::run_for(DiskROM *this,HalfCycles half_cycles)

{
  IntType IVar1;
  Cycles local_20;
  DiskROM *local_18;
  DiskROM *this_local;
  HalfCycles half_cycles_local;
  
  local_18 = this;
  this_local = (DiskROM *)half_cycles.super_WrappedInt<HalfCycles>.length_;
  IVar1 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
  this->controller_cycles_ = IVar1 * 800000 + this->controller_cycles_;
  Cycles::Cycles(&local_20,(long)(int)(this->controller_cycles_ / 0xaec85));
  WD::WD1770::run_for(&this->super_WD1770,local_20);
  this->controller_cycles_ = this->controller_cycles_ % 0xaec85;
  return;
}

Assistant:

void DiskROM::run_for(HalfCycles half_cycles) {
	// Input clock is going to be 7159090/2 Mhz, but the drive controller
	// needs an 8Mhz clock, so scale up. 8000000/7159090 simplifies to
	// 800000/715909.
	controller_cycles_ += 800000 * half_cycles.as_integral();
	WD::WD1770::run_for(Cycles(int(controller_cycles_ / 715909)));
	controller_cycles_ %= 715909;
}